

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netban.cpp
# Opt level: O0

void __thiscall CNetBan::CBanPool<NETADDR,_1>::Reset(CBanPool<NETADDR,_1> *this)

{
  long in_RDI;
  int i;
  uint size;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  int iVar1;
  
  size = (uint)((ulong)in_RDI >> 0x20);
  mem_zero((void *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),size);
  mem_zero((void *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),size);
  *(undefined8 *)(in_RDI + 0x22808) = 0;
  *(undefined4 *)(in_RDI + 0x22810) = 0;
  for (iVar1 = 1; iVar1 < 0x3ff; iVar1 = iVar1 + 1) {
    *(long *)(in_RDI + (long)iVar1 * 0x88 + 0x878) = in_RDI + 0x800 + (long)(iVar1 + 1) * 0x88;
    *(long *)(in_RDI + (long)iVar1 * 0x88 + 0x880) = in_RDI + 0x800 + (long)(iVar1 + -1) * 0x88;
  }
  *(long *)(in_RDI + 0x878) = in_RDI + 0x888;
  *(long *)(in_RDI + 0x227f8) = in_RDI + 0x226f0;
  *(long *)(in_RDI + 0x22800) = in_RDI + 0x800;
  return;
}

Assistant:

void CNetBan::CBanPool<T, HashCount>::Reset()
{
	mem_zero(m_paaHashList, sizeof(m_paaHashList));
	mem_zero(m_aBans, sizeof(m_aBans));
	m_pFirstUsed = 0;
	m_CountUsed = 0;

	for(int i = 1; i < MAX_BANS-1; ++i)
	{
		m_aBans[i].m_pNext = &m_aBans[i+1];
		m_aBans[i].m_pPrev = &m_aBans[i-1];
	}

	m_aBans[0].m_pNext = &m_aBans[1];
	m_aBans[MAX_BANS-1].m_pPrev = &m_aBans[MAX_BANS-2];
	m_pFirstFree = &m_aBans[0];
}